

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPathCommand.cxx
# Opt level: O2

string * __thiscall
cmFindPathCommand::FindHeaderInFramework
          (string *__return_storage_ptr__,cmFindPathCommand *this,string *file,string *dir)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  bool bVar3;
  long lVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  bool *pbVar6;
  Glob *pGVar7;
  allocator local_101;
  string glob;
  string frameWorkName;
  string fileName;
  Glob globIt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  
  std::__cxx11::string::string((string *)&fileName,(string *)file);
  frameWorkName._M_dataplus._M_p = (pointer)&frameWorkName.field_2;
  frameWorkName._M_string_length = 0;
  frameWorkName.field_2._M_local_buf[0] = '\0';
  lVar4 = std::__cxx11::string::find((char)&fileName,0x2f);
  if (lVar4 != -1) {
    std::__cxx11::string::substr((ulong)&globIt,(ulong)&fileName);
    std::__cxx11::string::operator=((string *)&fileName,(string *)&globIt);
    std::__cxx11::string::~string((string *)&globIt);
    std::__cxx11::string::_M_assign((string *)&frameWorkName);
    std::__cxx11::string::substr((ulong)&globIt,(ulong)&frameWorkName);
    std::__cxx11::string::operator=((string *)&frameWorkName,(string *)&globIt);
    std::__cxx11::string::~string((string *)&globIt);
    lVar4 = std::__cxx11::string::find((char)&frameWorkName,0x2f);
    if (lVar4 != -1) {
      std::__cxx11::string::_M_assign((string *)&fileName);
      std::__cxx11::string::assign((char *)&frameWorkName);
    }
    if (frameWorkName._M_string_length != 0) {
      std::__cxx11::string::string((string *)&globIt,(string *)dir);
      std::__cxx11::string::append((string *)&globIt);
      std::__cxx11::string::append((char *)&globIt);
      std::__cxx11::string::string((string *)&glob,(string *)&globIt);
      std::__cxx11::string::append((char *)&glob);
      std::__cxx11::string::append((string *)&glob);
      bVar3 = cmsys::SystemTools::FileExists(glob._M_dataplus._M_p);
      if (bVar3) {
        cVar2 = (this->super_cmFindBase).field_0x222;
        paVar1 = &__return_storage_ptr__->field_2;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
        if (cVar2 == '\x01') {
          paVar5 = &glob.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)glob._M_dataplus._M_p == paVar5) {
            paVar1->_M_allocated_capacity = glob.field_2._M_allocated_capacity;
            *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = glob.field_2._8_8_;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = glob._M_dataplus._M_p;
            (__return_storage_ptr__->field_2)._M_allocated_capacity =
                 glob.field_2._M_allocated_capacity;
          }
          pGVar7 = (Glob *)&glob;
        }
        else {
          paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)&globIt.Relative;
          if (globIt.Internals == (GlobInternals *)paVar5) {
            paVar1->_M_allocated_capacity = (size_type)globIt.Relative._M_dataplus._M_p;
            *(size_type *)((long)&__return_storage_ptr__->field_2 + 8) =
                 globIt.Relative._M_string_length;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)globIt.Internals;
            (__return_storage_ptr__->field_2)._M_allocated_capacity =
                 (size_type)globIt.Relative._M_dataplus._M_p;
          }
          pGVar7 = &globIt;
        }
        pbVar6 = &pGVar7->Recurse;
        __return_storage_ptr__->_M_string_length = *(size_type *)pbVar6;
        ((_Alloc_hider *)&((Glob *)(pbVar6 + -8))->Internals)->_M_p = (pointer)paVar5;
        *(size_type *)pbVar6 = 0;
        paVar5->_M_local_buf[0] = '\0';
        std::__cxx11::string::~string((string *)&glob);
        pGVar7 = &globIt;
        goto LAB_00351c4c;
      }
      std::__cxx11::string::~string((string *)&glob);
      std::__cxx11::string::~string((string *)&globIt);
    }
  }
  std::__cxx11::string::string((string *)&glob,(string *)dir);
  std::__cxx11::string::append((char *)&glob);
  std::__cxx11::string::append((string *)&glob);
  cmsys::Glob::Glob(&globIt);
  cmsys::Glob::FindFiles(&globIt,&glob,(GlobMessages *)0x0);
  __x = cmsys::Glob::GetFiles_abi_cxx11_(&globIt);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&files,__x);
  if (files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_101);
  }
  else {
    cmsys::SystemTools::CollapseFullPath
              (__return_storage_ptr__,
               files.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    if ((this->super_cmFindBase).field_0x222 == '\0') {
      std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&files);
  cmsys::Glob::~Glob(&globIt);
  pGVar7 = (Glob *)&glob;
LAB_00351c4c:
  std::__cxx11::string::~string((string *)pGVar7);
  std::__cxx11::string::~string((string *)&frameWorkName);
  std::__cxx11::string::~string((string *)&fileName);
  return __return_storage_ptr__;
}

Assistant:

std::string cmFindPathCommand::FindHeaderInFramework(std::string const& file,
                                                     std::string const& dir)
{
  std::string fileName = file;
  std::string frameWorkName;
  std::string::size_type pos = fileName.find('/');
  // if there is a / in the name try to find the header as a framework
  // For example bar/foo.h would look for:
  // bar.framework/Headers/foo.h
  if (pos != std::string::npos) {
    // remove the name from the slash;
    fileName = fileName.substr(pos + 1);
    frameWorkName = file;
    frameWorkName =
      frameWorkName.substr(0, frameWorkName.size() - fileName.size() - 1);
    // if the framework has a path in it then just use the filename
    if (frameWorkName.find('/') != std::string::npos) {
      fileName = file;
      frameWorkName = "";
    }
    if (!frameWorkName.empty()) {
      std::string fpath = dir;
      fpath += frameWorkName;
      fpath += ".framework";
      std::string intPath = fpath;
      intPath += "/Headers/";
      intPath += fileName;
      if (cmSystemTools::FileExists(intPath.c_str())) {
        if (this->IncludeFileInPath) {
          return intPath;
        }
        return fpath;
      }
    }
  }
  // if it is not found yet or not a framework header, then do a glob search
  // for all frameworks in the directory: dir/*.framework/Headers/<file>
  std::string glob = dir;
  glob += "*.framework/Headers/";
  glob += file;
  cmsys::Glob globIt;
  globIt.FindFiles(glob);
  std::vector<std::string> files = globIt.GetFiles();
  if (!files.empty()) {
    std::string fheader = cmSystemTools::CollapseFullPath(files[0]);
    if (this->IncludeFileInPath) {
      return fheader;
    }
    fheader.resize(fheader.size() - file.size());
    return fheader;
  }
  return "";
}